

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O1

void __thiscall
pybind11::detail::type_record::add_base
          (type_record *this,type_info *base,_func_void_ptr_void_ptr *caster)

{
  type_info *ptVar1;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  string tname;
  allocator local_159;
  string local_158;
  _func_void_ptr_void_ptr *local_138;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_138 = caster;
  local_130._M_dataplus._M_p = (pointer)base;
  ptVar1 = get_type_info((type_index *)&local_130,false);
  if (ptVar1 == (type_info *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_130,*(char **)(base + 8) + (**(char **)(base + 8) == '*'),
               (allocator *)&local_158);
    clean_type_id(&local_130);
    std::__cxx11::string::string((string *)&local_110,this->name,(allocator *)&local_90);
    std::operator+(&local_f0,"generic_type: type \"",&local_110);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_d0._M_dataplus._M_p = (pointer)*plVar2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar3) {
      local_d0.field_2._M_allocated_capacity = *psVar3;
      local_d0.field_2._8_8_ = plVar2[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar3;
    }
    local_d0._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::operator+(&local_b0,&local_d0,&local_130);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_158._M_dataplus._M_p = (pointer)*plVar2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_158._M_dataplus._M_p == psVar3) {
      local_158.field_2._M_allocated_capacity = *psVar3;
      local_158.field_2._8_8_ = plVar2[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar3;
    }
    local_158._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    pybind11_fail(&local_158);
  }
  if ((((byte)ptVar1->field_0x88 >> 2 ^ (byte)this->field_0x58 >> 3) & 1) == 0) {
    PyList_Append((this->bases).super_object.super_handle.m_ptr,ptVar1->type);
    if (ptVar1->type->tp_dictoffset != 0) {
      this->field_0x58 = this->field_0x58 | 2;
    }
    if (local_138 != (_func_void_ptr_void_ptr *)0x0) {
      std::
      vector<std::pair<std::type_info_const*,void*(*)(void*)>,std::allocator<std::pair<std::type_info_const*,void*(*)(void*)>>>
      ::emplace_back<std::type_info_const*&,void*(*&)(void*)>
                ((vector<std::pair<std::type_info_const*,void*(*)(void*)>,std::allocator<std::pair<std::type_info_const*,void*(*)(void*)>>>
                  *)&ptVar1->implicit_casts,&this->type,&local_138);
    }
    return;
  }
  std::__cxx11::string::string
            ((string *)&local_130,*(char **)(base + 8) + (**(char **)(base + 8) == '*'),
             (allocator *)&local_158);
  clean_type_id(&local_130);
  std::__cxx11::string::string((string *)&local_70,this->name,&local_159);
  std::operator+(&local_50,"generic_type: type \"",&local_70);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (local_90 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_110._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_110._M_dataplus._M_p == psVar3) {
    local_110.field_2._M_allocated_capacity = *psVar3;
    local_110.field_2._8_8_ = plVar2[3];
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar3;
  }
  local_110._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_f0._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_f0._M_dataplus._M_p == psVar3) {
    local_f0.field_2._M_allocated_capacity = *psVar3;
    local_f0.field_2._8_8_ = plVar2[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar3;
  }
  local_f0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::operator+(&local_d0,&local_f0,&local_130);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_b0._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar3) {
    local_b0.field_2._M_allocated_capacity = *psVar3;
    local_b0.field_2._8_8_ = plVar2[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar3;
  }
  local_b0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_158._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_158._M_dataplus._M_p == psVar3) {
    local_158.field_2._M_allocated_capacity = *psVar3;
    local_158.field_2._8_8_ = plVar2[3];
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  }
  else {
    local_158.field_2._M_allocated_capacity = *psVar3;
  }
  local_158._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  pybind11_fail(&local_158);
}

Assistant:

PYBIND11_NOINLINE void add_base(const std::type_info &base, void *(*caster)(void *)) {
        auto base_info = detail::get_type_info(base, false);
        if (!base_info) {
            std::string tname(base.name());
            detail::clean_type_id(tname);
            pybind11_fail("generic_type: type \"" + std::string(name) +
                          "\" referenced unknown base type \"" + tname + "\"");
        }

        if (default_holder != base_info->default_holder) {
            std::string tname(base.name());
            detail::clean_type_id(tname);
            pybind11_fail("generic_type: type \"" + std::string(name) + "\" " +
                    (default_holder ? "does not have" : "has") +
                    " a non-default holder type while its base \"" + tname + "\" " +
                    (base_info->default_holder ? "does not" : "does"));
        }

        bases.append((PyObject *) base_info->type);

        if (base_info->type->tp_dictoffset != 0)
            dynamic_attr = true;

        if (caster)
            base_info->implicit_casts.emplace_back(type, caster);
    }